

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O0

void __thiscall
xray_re::xr_mesh_vbuf::transform_points
          (xr_mesh_vbuf *this,fvector3 *source,fvector3 *target,size_t size,fmatrix *xform)

{
  _vector3<double> *p_Var1;
  _vector3<double> local_c8;
  undefined1 local_b0 [8];
  dmatrix m;
  fmatrix *xform_local;
  size_t size_local;
  fvector3 *target_local;
  fvector3 *source_local;
  xr_mesh_vbuf *this_local;
  
  m.field_0.field_0._44 = (double)xform;
  _matrix<double>::set<float>((_matrix<double> *)local_b0,xform);
  size_local = (size_t)target;
  target_local = source;
  for (xform_local = (fmatrix *)size; xform_local != (fmatrix *)0x0;
      xform_local = (fmatrix *)((long)&xform_local[-1].field_0 + 0x3f)) {
    memset(&local_c8,0,0x18);
    p_Var1 = _vector3<double>::set<float>(&local_c8,target_local);
    p_Var1 = _vector3<double>::transform(p_Var1,(_matrix<double> *)local_b0);
    _vector3<float>::set<double>((_vector3<float> *)size_local,p_Var1);
    size_local = size_local + 0xc;
    target_local = target_local + 1;
  }
  return;
}

Assistant:

void xr_mesh_vbuf::transform_points(const fvector3* source, fvector3* target, size_t size,
		const fmatrix& xform) const
{
	dmatrix m;
	m.set(xform);
	for (; size != 0; --size, ++target)
		target->set(dvector3().set(*source++).transform(m));
}